

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall ncnn::Net::~Net(Net *this)

{
  pointer plVar1;
  pointer ppLVar2;
  
  clear(this);
  plVar1 = (this->custom_layer_registry).
           super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)(this->custom_layer_registry).
                                 super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar1);
  }
  ppLVar2 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (ppLVar2 != (pointer)0x0) {
    operator_delete(ppLVar2,(long)(this->layers).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar2)
    ;
  }
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::~vector(&this->blobs);
  return;
}

Assistant:

Net::~Net()
{
    clear();

#if NCNN_VULKAN
#endif // NCNN_VULKAN
}